

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O1

void finalize(Mat *result,Mat *ocount)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar2 = *(int *)(result + 8);
  if (0 < (long)iVar2) {
    lVar6 = *(long *)(result + 0x10);
    lVar4 = **(long **)(result + 0x48);
    lVar7 = *(long *)(ocount + 0x10);
    lVar5 = **(long **)(ocount + 0x48);
    iVar3 = *(int *)(result + 0xc);
    lVar8 = 0;
    do {
      if (0 < iVar3) {
        lVar9 = 0;
        do {
          fVar1 = *(float *)(lVar7 + lVar9 * 4);
          if (0.0 < fVar1) {
            *(float *)(lVar6 + lVar9 * 4) = *(float *)(lVar6 + lVar9 * 4) / fVar1;
          }
          lVar9 = lVar9 + 1;
        } while (iVar3 != (int)lVar9);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + lVar5;
      lVar6 = lVar6 + lVar4;
    } while (lVar8 != iVar2);
  }
  return;
}

Assistant:

static
void finalize(cv::Mat &result, cv::Mat const &ocount)
{
#ifdef WITH_DISPATCH
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
  dispatch_apply(result.rows, queue,
                 ^(size_t y) {
                   float* p_res = result.ptr<float>(y);
                   float const* p_count = ocount.ptr<float>(y);
                   
                   for (int x = 0; x < result.cols; ++x, ++p_res, ++p_count)
                     if ( *p_count > 0.0 )
                       *p_res /= *p_count;
                 });
#else
  for (int y = 0; y < result.rows; ++y)
  {
    float* p_res = result.ptr<float>(y);
    float const* p_count = ocount.ptr<float>(y);

    for (int x = 0; x < result.cols; ++x, ++p_res, ++p_count)
      if ( *p_count > 0.0 )
        *p_res /= *p_count;
  }
#endif
}